

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O0

uint miniminer_tests::Find<transaction_identifier<false>,unsigned_int>
               (map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                *map,transaction_identifier<false> *key)

{
  bool bVar1;
  pointer ppVar2;
  long in_FS_OFFSET;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  lazy_ostream *in_stack_ffffffffffffff18;
  const_string *in_stack_ffffffffffffff20;
  unit_test_log_t *in_stack_ffffffffffffff28;
  const_string local_c0;
  lazy_ostream local_b0 [2];
  _Base_ptr local_90;
  assertion_result local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Base_ptr local_50;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (_Base_ptr)
             std::
             map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
             ::find((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                     *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                    (key_type *)in_stack_fffffffffffffee8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (pointer)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (unsigned_long)in_stack_fffffffffffffee8);
    args = &local_70;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffee8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18
               ,(const_string *)args);
    local_90 = (_Base_ptr)
               std::
               map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
               ::end((map<transaction_identifier<false>,_unsigned_int,_std::less<transaction_identifier<false>_>,_std::allocator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>_>
                      *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    std::operator==((_Self *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                    (_Self *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (bool)in_stack_fffffffffffffef7);
    in_stack_ffffffffffffff18 = boost::unit_test::lazy_ostream::instance();
    transaction_identifier<false>::ToString_abi_cxx11_
              ((transaction_identifier<false> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    tinyformat::format<std::__cxx11::string>((char *)in_stack_ffffffffffffff18,args);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (pointer)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (unsigned_long)in_stack_fffffffffffffee8);
    in_stack_fffffffffffffee8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion(&local_88,local_b0,&local_c0,0x47,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(in_stack_fffffffffffffee8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffee8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>::
           operator->((_Rb_tree_const_iterator<std::pair<const_transaction_identifier<false>,_unsigned_int>_>
                       *)in_stack_fffffffffffffee8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return ppVar2->second;
  }
  __stack_chk_fail();
}

Assistant:

Value Find(const std::map<Key, Value>& map, const Key& key)
{
    auto it = map.find(key);
    BOOST_CHECK_MESSAGE(it != map.end(), strprintf("Cannot find %s", key.ToString()));
    return it->second;
}